

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writePrlFile(MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *pQVar2;
  iterator iVar3;
  QString *this_00;
  QString *pQVar4;
  QTextStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Iterator it_1;
  QString sep;
  Iterator it;
  ProStringList libs;
  QString bdir;
  undefined4 in_stack_fffffffffffff728;
  SectionFlag in_stack_fffffffffffff72c;
  QMakeProject *in_stack_fffffffffffff730;
  QMakeProject *in_stack_fffffffffffff738;
  ProString *in_stack_fffffffffffff740;
  QMakeProject *in_stack_fffffffffffff748;
  ProStringList *in_stack_fffffffffffff750;
  ProString *in_stack_fffffffffffff758;
  QTextStream *in_stack_fffffffffffff760;
  ProStringList *in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff788;
  bool local_861;
  QChar local_71a;
  undefined1 local_718 [28];
  QChar local_6fc;
  QChar local_6fa;
  undefined1 local_6f8 [24];
  iterator local_6e0;
  QString local_6d8;
  undefined1 local_6c0 [24];
  iterator local_6a8 [40];
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined1 local_3d0 [120];
  undefined1 local_358 [120];
  undefined1 local_2e0 [120];
  undefined1 local_268 [168];
  undefined1 local_1c0 [120];
  undefined1 local_148 [78];
  QChar local_fa [49];
  undefined1 local_98 [72];
  undefined1 local_50 [48];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffff730,
                   (QString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QString::isEmpty((QString *)0x18313a);
  if (bVar1) {
    qmake_getpwd();
    QString::operator=((QString *)in_stack_fffffffffffff730,
                       (QString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QString::~QString((QString *)0x18316f);
  }
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_BUILD_DIR =");
  ProString::ProString
            ((ProString *)in_stack_fffffffffffff730,
             (QString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  qv(in_stack_fffffffffffff740);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  ::operator<<((QTextStream *)in_stack_fffffffffffff730,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  QString::~QString((QString *)0x1831e6);
  ProString::~ProString((ProString *)0x1831f3);
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRO_INPUT =");
  QMakeProject::projectFile
            ((QMakeProject *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  QChar::QChar<char,_true>(local_fa,'/');
  QFlags<QString::SectionFlag>::QFlags
            ((QFlags<QString::SectionFlag> *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
  QString::section(&in_stack_fffffffffffff758->m_string,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff788 >> 0x30),
                   (qsizetype)in_stack_fffffffffffff750,(qsizetype)in_stack_fffffffffffff748,
                   (QFlagsStorageHelper<QString::SectionFlag,_4>)SUB84(in_stack_fffffffffffff788,0))
  ;
  ProString::ProString
            ((ProString *)in_stack_fffffffffffff730,
             (QString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  qv(in_stack_fffffffffffff740);
  QTextStream::operator<<(pQVar2,(QString *)local_98);
  ::operator<<((QTextStream *)in_stack_fffffffffffff730,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  QString::~QString((QString *)0x1832dc);
  ProString::~ProString((ProString *)0x1832e9);
  QString::~QString((QString *)0x1832f6);
  QString::~QString((QString *)0x183303);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x183359);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_SOURCE_DIR =");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeEvaluator::first
              (&in_stack_fffffffffffff748->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff740)
    ;
    qv(in_stack_fffffffffffff740);
    QTextStream::operator<<(pQVar2,(QString *)local_148);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x183416);
    ProString::~ProString((ProString *)0x183423);
    ProKey::~ProKey((ProKey *)0x183430);
  }
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_TARGET =");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  QMakeEvaluator::first
            (&in_stack_fffffffffffff748->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff740);
  qv(in_stack_fffffffffffff740);
  QTextStream::operator<<(pQVar2,(QString *)local_1c0);
  ::operator<<((QTextStream *)in_stack_fffffffffffff730,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  QString::~QString((QString *)0x1834dd);
  ProString::~ProString((ProString *)0x1834ea);
  ProKey::~ProKey((ProKey *)0x1834f7);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x18354d);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_DEFINES =");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeProject::values
              (in_stack_fffffffffffff730,
               (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    qv(in_stack_fffffffffffff750);
    QTextStream::operator<<(pQVar2,(QString *)local_268);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x1835fd);
    ProKey::~ProKey((ProKey *)0x18360a);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x183660);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_CFLAGS =");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeProject::values
              (in_stack_fffffffffffff730,
               (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    qv(in_stack_fffffffffffff750);
    QTextStream::operator<<(pQVar2,(QString *)local_2e0);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x183710);
    ProKey::~ProKey((ProKey *)0x18371d);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x183773);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_CXXFLAGS =");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeProject::values
              (in_stack_fffffffffffff730,
               (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    qv(in_stack_fffffffffffff750);
    QTextStream::operator<<(pQVar2,(QString *)local_358);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x183823);
    ProKey::~ProKey((ProKey *)0x183830);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x183886);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_PRL_CONFIG =");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeProject::values
              (in_stack_fffffffffffff730,
               (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    qv(in_stack_fffffffffffff750);
    QTextStream::operator<<(pQVar2,(QString *)local_3d0);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x183936);
    ProKey::~ProKey((ProKey *)0x183943);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
  ProKey::~ProKey((ProKey *)0x183999);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff748,(ProKey *)in_stack_fffffffffffff740);
    ProKey::~ProKey((ProKey *)0x183aa9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QTextStream::operator<<(in_RSI,"QMAKE_PRL_VERSION = ");
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                     (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      QMakeEvaluator::first
                (&in_stack_fffffffffffff748->super_QMakeEvaluator,
                 (ProKey *)in_stack_fffffffffffff740);
      ::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::~ProString((ProString *)0x183b4b);
      ProKey::~ProKey((ProKey *)0x183b58);
    }
  }
  else {
    QTextStream::operator<<(in_RSI,"QMAKE_PRL_VERSION = ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff730,
                   (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    QMakeEvaluator::first
              (&in_stack_fffffffffffff748->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff740)
    ;
    ::operator<<(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    ProString::~ProString((ProString *)0x183a41);
    ProKey::~ProKey((ProKey *)0x183a4e);
  }
  QString::QString((QString *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff768);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffff738,(QString *)in_stack_fffffffffffff730,
                     SUB41(in_stack_fffffffffffff72c >> 0x18,0));
  local_861 = true;
  if (!bVar1) {
    QString::QString((QString *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff768);
    local_861 = QMakeProject::isActiveConfig
                          (in_stack_fffffffffffff738,(QString *)in_stack_fffffffffffff730,
                           SUB41(in_stack_fffffffffffff72c >> 0x18,0));
    QString::~QString((QString *)0x183c14);
  }
  QString::~QString((QString *)0x183c21);
  if (local_861 != false) {
    local_568 = 0xaaaaaaaaaaaaaaaa;
    local_560 = 0xaaaaaaaaaaaaaaaa;
    local_558 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x183c68);
    QString::QString((QString *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff768);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff738,(QString *)in_stack_fffffffffffff730,
                       SUB41(in_stack_fffffffffffff72c >> 0x18,0));
    QString::~QString((QString *)0x183cb7);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      ProStringList::operator<<
                ((ProStringList *)in_stack_fffffffffffff730,
                 (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      ProStringList::operator<<
                ((ProStringList *)in_stack_fffffffffffff730,
                 (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      in_stack_fffffffffffff768 =
           ProStringList::operator<<
                     ((ProStringList *)in_stack_fffffffffffff730,
                      (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      ProStringList::operator<<
                ((ProStringList *)in_stack_fffffffffffff730,
                 (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::~ProString((ProString *)0x183deb);
      ProString::~ProString((ProString *)0x183df8);
      ProString::~ProString((ProString *)0x183e05);
      ProString::~ProString((ProString *)0x183e12);
    }
    else {
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      ProStringList::operator<<
                ((ProStringList *)in_stack_fffffffffffff730,
                 (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::ProString((ProString *)in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff748)
      ;
      ProStringList::operator<<
                ((ProStringList *)in_stack_fffffffffffff730,
                 (ProString *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      ProString::~ProString((ProString *)0x183d22);
      ProString::~ProString((ProString *)0x183d2f);
    }
    QTextStream::operator<<(in_RSI,"QMAKE_PRL_LIBS =");
    local_6a8[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_6a8[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff730);
    while( true ) {
      iVar3 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff730);
      bVar1 = QList<ProString>::iterator::operator!=(local_6a8,iVar3);
      if (!bVar1) break;
      pQVar2 = in_RSI;
      QList<ProString>::iterator::operator*(local_6a8);
      QMakeProject::values
                (in_stack_fffffffffffff730,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      qv((ProStringList *)pQVar2);
      QTextStream::operator<<(pQVar2,(QString *)local_6c0);
      QString::~QString((QString *)0x183ef4);
      QList<ProString>::iterator::operator++(local_6a8);
    }
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QTextStream::operator<<(in_RSI,"QMAKE_PRL_LIBS_FOR_CMAKE = ");
    local_6d8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_6d8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_6d8.d.size = -0x5555555555555556;
    QString::QString((QString *)0x183f68);
    local_6e0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_6e0 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff730);
    while( true ) {
      iVar3 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff730);
      bVar1 = QList<ProString>::iterator::operator!=(&local_6e0,iVar3);
      if (!bVar1) break;
      pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)&local_6d8);
      in_stack_fffffffffffff730 = *(QMakeProject **)(in_RDI + 0xd8);
      QList<ProString>::iterator::operator*(&local_6e0);
      this_00 = (QString *)
                QMakeProject::values
                          (in_stack_fffffffffffff730,
                           (ProKey *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      QChar::QChar<char,_true>(&local_6fa,';');
      ProStringList::join((ProStringList *)
                          CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                          (QChar)(char16_t)((ulong)this_00 >> 0x30));
      QChar::QChar<char,_true>(&local_6fc,'\\');
      QString::QString(this_00,(char *)in_stack_fffffffffffff768);
      pQVar4 = (QString *)
               QString::replace((QChar)(char16_t)local_6f8,(QString *)(ulong)(ushort)local_6fc.ucs,
                                (CaseSensitivity)local_718);
      QTextStream::operator<<(pQVar2,pQVar4);
      QString::~QString((QString *)0x1840aa);
      QString::~QString((QString *)0x1840b7);
      QChar::QChar<char,_true>(&local_71a,';');
      QString::operator=(&local_6d8,local_71a);
      QList<ProString>::iterator::operator++(&local_6e0);
    }
    ::operator<<((QTextStream *)in_stack_fffffffffffff730,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
    ;
    QString::~QString((QString *)0x184111);
    ProStringList::~ProStringList((ProStringList *)0x18411e);
  }
  QString::~QString((QString *)0x18412b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writePrlFile(QTextStream &t)
{
    QString bdir = Option::output_dir;
    if(bdir.isEmpty())
        bdir = qmake_getpwd();
    t << "QMAKE_PRL_BUILD_DIR =" << qv(bdir) << Qt::endl;

    t << "QMAKE_PRO_INPUT =" << qv(project->projectFile().section('/', -1)) << Qt::endl;

    if(!project->isEmpty("QMAKE_ABSOLUTE_SOURCE_PATH"))
        t << "QMAKE_PRL_SOURCE_DIR =" << qv(project->first("QMAKE_ABSOLUTE_SOURCE_PATH")) << Qt::endl;
    t << "QMAKE_PRL_TARGET =" << qv(project->first("LIB_TARGET")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_DEFINES"))
        t << "QMAKE_PRL_DEFINES =" << qv(project->values("PRL_EXPORT_DEFINES")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CFLAGS"))
        t << "QMAKE_PRL_CFLAGS =" << qv(project->values("PRL_EXPORT_CFLAGS")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CXXFLAGS"))
        t << "QMAKE_PRL_CXXFLAGS =" << qv(project->values("PRL_EXPORT_CXXFLAGS")) << Qt::endl;
    if(!project->isEmpty("CONFIG"))
        t << "QMAKE_PRL_CONFIG =" << qv(project->values("CONFIG")) << Qt::endl;
    if(!project->isEmpty("TARGET_VERSION_EXT"))
        t << "QMAKE_PRL_VERSION = " << project->first("TARGET_VERSION_EXT") << Qt::endl;
    else if(!project->isEmpty("VERSION"))
        t << "QMAKE_PRL_VERSION = " << project->first("VERSION") << Qt::endl;
    if(project->isActiveConfig("staticlib") || project->isActiveConfig("explicitlib")) {
        ProStringList libs;
        if (!project->isActiveConfig("staticlib"))
            libs << "LIBS" << "QMAKE_LIBS";
        else
            libs << "LIBS" << "LIBS_PRIVATE" << "QMAKE_LIBS" << "QMAKE_LIBS_PRIVATE";
        t << "QMAKE_PRL_LIBS =";
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it)
            t << qv(project->values((*it).toKey()));
        t << Qt::endl;

        t << "QMAKE_PRL_LIBS_FOR_CMAKE = ";
        QString sep;
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it) {
            t << sep << project->values((*it).toKey()).join(';').replace('\\', "\\\\");
            sep = ';';
        }
        t << Qt::endl;
    }
}